

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseInputCommand(WastParser *this,CommandPtr *param_1)

{
  Result RVar1;
  string text;
  Location loc;
  Var var;
  string local_118;
  char *local_f8;
  size_type sStack_f0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_e8;
  undefined8 uStack_e0;
  Var local_d0;
  Location local_88;
  Var local_68;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ != Error) {
    GetToken((Token *)&local_d0,this);
    local_e8.offset = (size_t)local_d0.loc.field_1.field_1.offset;
    uStack_e0 = local_d0.loc.field_1._8_8_;
    local_f8 = local_d0.loc.filename.data_;
    sStack_f0 = local_d0.loc.filename.size_;
    RVar1 = Expect(this,Input);
    if (RVar1.enum_ != Error) {
      Error(this,0x19c12c);
      local_118.field_2._M_allocated_capacity._0_4_ = 0;
      local_118.field_2._4_8_ = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length._0_4_ = 0;
      local_118._M_string_length._4_4_ = 0;
      Var::Var(&local_d0,0xffffffff,(Location *)&local_118);
      local_118._M_string_length._0_4_ = 0;
      local_118._M_string_length._4_4_ = 0;
      local_118.field_2._M_allocated_capacity._0_4_ =
           local_118.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_88.field_1.field_0.line = 0;
      local_88.field_1._4_8_ = 0;
      local_88.filename.data_ = (char *)0x0;
      local_88.filename.size_._0_4_ = 0;
      local_88.filename.size_._4_4_ = 0;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      Var::Var(&local_68,0xffffffff,&local_88);
      ParseVarOpt(this,&local_d0,&local_68);
      Var::~Var(&local_68);
      RVar1 = ParseQuotedText(this,&local_118);
      if (RVar1.enum_ != Error) {
        Expect(this,Rpar);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      Var::~Var(&local_d0);
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInputCommand(CommandPtr*) {
  // Parse the input command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseInputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Input);
  Error(loc, "input command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  CHECK_RESULT(ParseQuotedText(&text));
  EXPECT(Rpar);
  return Result::Error;
}